

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O2

string * __thiscall Unit::getName_abi_cxx11_(string *__return_storage_ptr__,Unit *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->sUnitName);
  return __return_storage_ptr__;
}

Assistant:

string Unit::getName()
{
	return sUnitName;
}